

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O2

void * stbds_arrgrowf(void *a,size_t elemsize,size_t addlen,size_t min_cap)

{
  undefined8 *puVar1;
  void *__ptr;
  ulong uVar2;
  
  if (a == (void *)0x0) {
    if (addlen <= min_cap) {
      addlen = min_cap;
    }
    if (addlen == 0) {
      return (void *)0x0;
    }
  }
  else {
    addlen = addlen + *(long *)((long)a + -0x20);
    if (addlen <= min_cap) {
      addlen = min_cap;
    }
    if (addlen <= *(ulong *)((long)a + -0x18)) {
      return a;
    }
    uVar2 = *(ulong *)((long)a + -0x18) * 2;
    if (addlen < uVar2) goto LAB_0010874e;
  }
  uVar2 = 4;
  if (4 < addlen) {
    uVar2 = addlen;
  }
LAB_0010874e:
  __ptr = (void *)((long)a + -0x20);
  if (a == (void *)0x0) {
    __ptr = (void *)0x0;
  }
  puVar1 = (undefined8 *)realloc(__ptr,elemsize * uVar2 + 0x20);
  if (a == (void *)0x0) {
    *puVar1 = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
  }
  puVar1[1] = uVar2;
  return puVar1 + 4;
}

Assistant:

void *stbds_arrgrowf(void *a, size_t elemsize, size_t addlen, size_t min_cap)
{
  stbds_array_header temp={0}; // force debugging
  void *b;
  size_t min_len = stbds_arrlen(a) + addlen;
  (void) sizeof(temp);

  // compute the minimum capacity needed
  if (min_len > min_cap)
    min_cap = min_len;

  if (min_cap <= stbds_arrcap(a))
    return a;

  // increase needed capacity to guarantee O(1) amortized
  if (min_cap < 2 * stbds_arrcap(a))
    min_cap = 2 * stbds_arrcap(a);
  else if (min_cap < 4)
    min_cap = 4;

  //if (num_prev < 65536) if (a) prev_allocs[num_prev++] = (int *) ((char *) a+1);
  //if (num_prev == 2201)
  //  num_prev = num_prev;
  b = STBDS_REALLOC(NULL, (a) ? stbds_header(a) : 0, elemsize * min_cap + sizeof(stbds_array_header));
  //if (num_prev < 65536) prev_allocs[num_prev++] = (int *) (char *) b;
  b = (char *) b + sizeof(stbds_array_header);
  if (a == NULL) {
    stbds_header(b)->length = 0;
    stbds_header(b)->hash_table = 0;
    stbds_header(b)->temp = 0;
  } else {
    STBDS_STATS(++stbds_array_grow);
  }
  stbds_header(b)->capacity = min_cap;

  return b;
}